

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O2

vec3 __thiscall fw::FreeCamera::getWorldRightDirection(FreeCamera *this)

{
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 aVar1;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_38;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_28;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_18;
  
  local_28.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )getWorldForwardDirection(this);
  local_38._0_8_ = *(undefined8 *)&(this->_upDirection).field_0;
  local_38.field_0.z = (this->_upDirection).field_0.field_0.z;
  local_18.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::detail::compute_cross<float,_(glm::precision)0,_false>::call
                   ((tvec3<float,_(glm::precision)0> *)&local_28.field_0,
                    (tvec3<float,_(glm::precision)0> *)&local_38.field_0);
  aVar1.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::detail::compute_normalize<float,_(glm::precision)0,_glm::tvec3,_false>::call
                   ((tvec3<float,_(glm::precision)0> *)&local_18.field_0);
  return (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)
         (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)aVar1.field_0;
}

Assistant:

glm::vec3 FreeCamera::getWorldRightDirection() const
{
    return glm::normalize(
        glm::cross(getWorldForwardDirection(), getWorldUpDirection())
    );
}